

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>_>::ForcePrepareIntPtIndices
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>_> *this)

{
  int iVar1;
  uint uVar2;
  TPZMaterial *pTVar3;
  long *plVar4;
  TPZIntPoints *pTVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  
  pTVar3 = TPZCompEl::Material((TPZCompEl *)this);
  if ((pTVar3 != (TPZMaterial *)0x0) &&
     (plVar4 = (long *)__dynamic_cast(pTVar3,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                      0xfffffffffffffffe), plVar4 != (long *)0x0)) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>).
                                   super_TPZMultiphysicsElement.super_TPZCompEl + 0x180))(this);
    if (iVar1 != 0) {
      pTVar5 = TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>::GetIntegrationRule
                         (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>);
      uVar2 = (*pTVar5->_vptr_TPZIntPoints[3])(pTVar5);
      TPZManVector<long,_128>::Resize
                (&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)(int)uVar2);
      if (((int)uVar2 < 1) || (gSinglePointMemory == false)) {
        uVar8 = 0;
        uVar7 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar7 = uVar8;
        }
        for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          iVar1 = (**(code **)(*plVar4 + 0x58))(plVar4,0xffffffff);
          (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore[uVar8] =
               (long)iVar1;
        }
      }
      else {
        iVar1 = (**(code **)(*plVar4 + 0x58))(plVar4);
        plVar4 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
        for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
          plVar4[uVar7] = (long)iVar1;
        }
      }
    }
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar6 = std::operator<<(poVar6,
                           "virtual void TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>>::ForcePrepareIntPtIndices() [TBASE = TPZMultiphysicsCompEl<pzgeom::TPZGeoTriangle>]"
                          );
  std::operator<<(poVar6," this->Material() == NULL\n");
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ForcePrepareIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if(!material || !matWithMem){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    if (this->NumberOfCompElementsInsideThisCompEl() == 0) {
        // This is suposed to happen if in the constructor of a multiphysics element. The CompEl vector is only initialized after the autobuild
        return;
    }
    
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    
    fIntPtIndices.Resize(intrulepoints);
    
    if(gSinglePointMemory && intrulepoints > 0)
    {
        int64_t point_index = matWithMem->PushMemItem();
#ifdef PZDEBUG
        if(point_index < 0)
        {
            std::cout << __PRETTY_FUNCTION__ << " material has no memory interface\n";
        }
#endif
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = point_index;
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
    }
    else
    {
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = matWithMem->PushMemItem();
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
          //entries in the related pzmatwithmem for further use.
    }
    
}